

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_compressionParameters cParams;
  ZSTD_CCtx_params params_00;
  uint uVar1;
  void *dict_00;
  undefined8 unaff_RBX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ZSTD_CCtx *in_R9;
  undefined1 in_stack_00000000 [12];
  undefined8 in_stack_0000000c;
  ZSTD_CDict *in_stack_00000014;
  undefined8 in_stack_0000001c;
  ZSTD_strategy in_stack_00000024;
  undefined1 in_stack_00000028 [48];
  U64 in_stack_00000058;
  ZSTD_buffered_policy_e in_stack_00000060;
  size_t errcod;
  ZSTD_CDict *cdict_00;
  undefined8 uVar2;
  ZSTD_strategy ZVar3;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_fffffffffffffff0;
  
  cParams._8_8_ = in_stack_00000014;
  cParams._0_8_ = in_stack_0000000c;
  cParams._16_8_ = in_stack_0000001c;
  cParams.strategy = in_stack_00000024;
  cdict_00 = in_stack_00000014;
  uVar2 = in_stack_0000001c;
  ZVar3 = in_stack_00000024;
  dict_00 = (void *)ZSTD_checkCParams(cParams);
  uVar1 = ERR_isError((size_t)dict_00);
  if (uVar1 == 0) {
    params_00.cParams.chainLog = (int)in_RDI;
    params_00.cParams.hashLog = (int)((ulong)in_RDI >> 0x20);
    params_00.format = (int)in_RSI;
    params_00.cParams.windowLog = (int)((ulong)in_RSI >> 0x20);
    params_00.cParams.searchLog = (int)in_stack_fffffffffffffff0;
    params_00.cParams.searchLength = (int)((ulong)in_stack_fffffffffffffff0 >> 0x20);
    params_00.cParams.targetLength = (int)unaff_RBX;
    params_00.cParams.strategy = (int)((ulong)unaff_RBX >> 0x20);
    params_00._44_8_ = in_stack_0000000c;
    params_00.fParams = (ZSTD_frameParameters)in_stack_00000000;
    params_00._52_8_ = in_stack_00000014;
    params_00._60_8_ = in_stack_0000001c;
    params_00.ldmParams.enableLdm = in_stack_00000024;
    params_00._72_48_ = in_stack_00000028;
    dict_00 = (void *)ZSTD_compressBegin_internal
                                (in_R9,dict_00,CONCAT44(in_stack_ffffffffffffffbc,ZVar3),
                                 (ZSTD_dictContentType_e)((ulong)uVar2 >> 0x20),
                                 (ZSTD_dictTableLoadMethod_e)uVar2,cdict_00,params_00,
                                 in_stack_00000058,in_stack_00000060);
  }
  return (size_t)dict_00;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    ZSTD_CCtx_params params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params.cParams.windowLog);
    /* compression parameters verification and optimization */
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}